

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aperiodicity_extraction_by_world.cc
# Opt level: O3

void __thiscall
sptk::AperiodicityExtractionByWorld::AperiodicityExtractionByWorld
          (AperiodicityExtractionByWorld *this,int fft_length,int frame_shift,double sampling_rate)

{
  bool bVar1;
  
  (this->super_AperiodicityExtractionInterface)._vptr_AperiodicityExtractionInterface =
       (_func_int **)&PTR__AperiodicityExtractionInterface_0011eca8;
  this->fft_length_ = fft_length;
  this->frame_shift_ = frame_shift;
  this->sampling_rate_ = sampling_rate;
  this->is_valid_ = true;
  if ((0 < frame_shift && 0 < fft_length) &&
     (bVar1 = IsInRange(sampling_rate,8000.0,98000.0), bVar1)) {
    return;
  }
  this->is_valid_ = false;
  return;
}

Assistant:

AperiodicityExtractionByWorld::AperiodicityExtractionByWorld(
    int fft_length, int frame_shift, double sampling_rate)
    : fft_length_(fft_length),
      frame_shift_(frame_shift),
      sampling_rate_(sampling_rate),
      is_valid_(true) {
  if (fft_length <= 0 || frame_shift_ <= 0 ||
      !sptk::IsInRange(sampling_rate_, 8000.0, 98000.0)) {
    is_valid_ = false;
    return;
  }
}